

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

OrderedArgumentSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::OrderedArgumentSyntax,slang::syntax::OrderedArgumentSyntax_const&>
          (BumpAllocator *this,OrderedArgumentSyntax *args)

{
  SyntaxNode *pSVar1;
  PropertyExprSyntax *pPVar2;
  SyntaxKind SVar3;
  undefined4 uVar4;
  OrderedArgumentSyntax *pOVar5;
  
  pOVar5 = (OrderedArgumentSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((OrderedArgumentSyntax *)this->endPtr < pOVar5 + 1) {
    pOVar5 = (OrderedArgumentSyntax *)allocateSlow(this,0x20,8);
  }
  else {
    this->head->current = (byte *)(pOVar5 + 1);
  }
  SVar3 = (args->super_ArgumentSyntax).super_SyntaxNode.kind;
  uVar4 = *(undefined4 *)&(args->super_ArgumentSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_ArgumentSyntax).super_SyntaxNode.parent;
  pPVar2 = (args->expr).ptr;
  (pOVar5->super_ArgumentSyntax).super_SyntaxNode.previewNode =
       (args->super_ArgumentSyntax).super_SyntaxNode.previewNode;
  (pOVar5->expr).ptr = pPVar2;
  (pOVar5->super_ArgumentSyntax).super_SyntaxNode.kind = SVar3;
  *(undefined4 *)&(pOVar5->super_ArgumentSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pOVar5->super_ArgumentSyntax).super_SyntaxNode.parent = pSVar1;
  return pOVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }